

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

uint Extra_TruthCanonN(uint uTruth,int nVars)

{
  uint uVar1;
  undefined4 local_20;
  int i;
  int nMints;
  uint uPhase;
  uint uTruthMin;
  int nVars_local;
  uint uTruth_local;
  
  nMints = -1;
  for (local_20 = 0; local_20 < 1 << ((byte)nVars & 0x1f); local_20 = local_20 + 1) {
    uVar1 = Extra_TruthPolarize(uTruth,local_20,nVars);
    if (uVar1 < (uint)nMints) {
      nMints = uVar1;
    }
  }
  return nMints;
}

Assistant:

unsigned Extra_TruthCanonN( unsigned uTruth, int nVars )
{
    unsigned uTruthMin, uPhase;
    int nMints, i;
    nMints    = (1 << nVars);
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        if ( uTruthMin > uPhase )
            uTruthMin = uPhase;
    }
    return uTruthMin;
}